

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(Matrix44<double> *A)

{
  Matrix44<double> *in_RDI;
  Matrix44<double> *pMVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int i;
  int dim;
  Matrix44<double> A3;
  Matrix44<double> A2;
  Matrix44<double> A1;
  T threshold;
  Matrix44<double> V;
  Matrix44<double> U;
  TV S;
  TV maxV;
  TV minV;
  int local_2f8;
  Matrix44 local_2f0 [16];
  Matrix44<double> *in_stack_fffffffffffffd20;
  Matrix44<double> local_270;
  Matrix44<double> local_1f0;
  BaseType_conflict3 local_170;
  Matrix44<double> local_168;
  Matrix44<double> local_e8;
  Vec4<double> local_68;
  Vec4<double> local_48;
  Vec4<double> local_28;
  Matrix44<double> *local_8;
  
  local_8 = in_RDI;
  Imath_3_2::Vec4<double>::Vec4(&local_28);
  Imath_3_2::Vec4<double>::Vec4(&local_48);
  Imath_3_2::Vec4<double>::Vec4(&local_68);
  Imath_3_2::Matrix44<double>::Matrix44(&local_e8);
  Imath_3_2::Matrix44<double>::Matrix44(&local_168);
  local_170 = computeThreshold<Imath_3_2::Matrix44<double>>(in_stack_fffffffffffffd20);
  Imath_3_2::Matrix44<double>::Matrix44(&local_1f0,local_8);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix44<double>,Imath_3_2::Vec4<double>>
            ((Matrix44 *)&local_1f0,(Vec4 *)&local_28);
  Imath_3_2::Matrix44<double>::Matrix44(&local_270,local_8);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix44<double>,Imath_3_2::Vec4<double>>
            ((Matrix44 *)&local_270,(Vec4 *)&local_48);
  Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)local_2f0,local_8);
  dVar2 = std::numeric_limits<double>::epsilon();
  Imath_3_2::jacobiSVD<double>
            (local_2f0,(Matrix44 *)&local_e8,(Vec4 *)&local_68,(Matrix44 *)&local_168,dVar2,false);
  local_2f8 = 0;
  while( true ) {
    if (3 < local_2f8) {
      return;
    }
    Imath_3_2::Vec4<double>::operator[](&local_28,local_2f8);
    pMVar1 = &local_168;
    Imath_3_2::Matrix44<double>::operator[](pMVar1,local_2f8);
    std::abs((int)pMVar1);
    if (local_170 <= extraout_XMM0_Qa) break;
    Imath_3_2::Vec4<double>::operator[](&local_48,local_2f8);
    pMVar1 = &local_168;
    Imath_3_2::Matrix44<double>::operator[](pMVar1,local_2f8);
    std::abs((int)pMVar1);
    if (local_170 <= extraout_XMM0_Qa_00) {
      __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<double>]"
                   );
    }
    local_2f8 = local_2f8 + 1;
  }
  __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<double>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}